

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementBeamEuler::ComputeStiffnessMatrix(ChElementBeamEuler *this)

{
  ChMatrixDynamic<> *expr;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  element_type *peVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar21;
  bool bVar22;
  double *pdVar23;
  ulong uVar24;
  double *pdVar25;
  ulong uVar26;
  long lVar27;
  double *pdVar28;
  undefined1 auVar29 [16];
  double in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 extraout_var [56];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  double dVar56;
  ChMatrixDynamic<> CKtemp;
  assign_op<double,_double> local_181;
  double local_180;
  DenseStorage<double,__1,__1,__1,_1> local_178;
  undefined1 local_158 [16];
  double local_148;
  undefined8 uStack_140;
  double local_130;
  double local_128;
  double local_120;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_118;
  ChMatrix33<double> local_d8;
  double local_88;
  undefined8 uStack_80;
  ChMatrixRef local_70;
  ChMatrixRef local_48;
  undefined1 auVar35 [64];
  
  local_158._8_8_ = local_158._0_8_;
  peVar14 = (this->section).
            super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar14 == (element_type *)0x0) {
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0xae,"void chrono::fea::ChElementBeamEuler::ComputeStiffnessMatrix()");
  }
  (*(peVar14->super_ChBeamSection)._vptr_ChBeamSection[2])();
  local_148 = in_XMM0_Qa;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[4])();
  local_180 = in_XMM0_Qa;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[5])();
  local_158._0_8_ = in_XMM0_Qa;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[3])();
  local_120 = in_XMM0_Qa;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[7])();
  local_88 = in_XMM0_Qa;
  uStack_80 = in_XMM0_Qb;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[8])();
  local_130 = in_XMM0_Qa;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[9])();
  local_128 = in_XMM0_Qa;
  (*(((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChBeamSection)._vptr_ChBeamSection[10])();
  uVar24 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
  if ((0 < (long)uVar24) &&
     (uVar15 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
               .m_cols, 0 < (long)uVar15)) {
    dVar1 = (this->super_ChElementBeam).length;
    expr = &this->Km;
    pdVar23 = (expr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
              m_data;
    local_148 = local_148 / dVar1;
    *pdVar23 = local_148;
    if ((uVar24 != 1) && (uVar15 != 1)) {
      dVar51 = dVar1 * dVar1;
      dVar48 = ((double)local_158._0_8_ * 12.0) / (dVar1 * dVar51);
      pdVar23[uVar15 + 1] = dVar48;
      if ((2 < uVar24) && (2 < uVar15)) {
        dVar52 = (local_180 * 12.0) / (dVar1 * dVar51);
        pdVar23[uVar15 * 2 + 2] = dVar52;
        if ((3 < uVar24) && (3 < uVar15)) {
          local_120 = local_120 / dVar1;
          pdVar23[uVar15 * 3 + 3] = local_120;
          if ((4 < uVar24) && (4 < uVar15)) {
            dVar56 = (local_180 * 4.0) / dVar1;
            pdVar23[uVar15 * 4 + 4] = dVar56;
            if ((5 < uVar24) && (5 < uVar15)) {
              dVar55 = ((double)local_158._0_8_ * 4.0) / dVar1;
              pdVar23[uVar15 * 5 + 5] = dVar55;
              if (((((((6 < uVar24) && (6 < uVar15)) &&
                     (pdVar23[uVar15 * 6 + 6] = local_148, 7 < uVar24)) &&
                    ((7 < uVar15 && (pdVar23[uVar15 * 7 + 7] = dVar48, 8 < uVar24)))) &&
                   (8 < uVar15)) &&
                  (((pdVar23[uVar15 * 8 + 8] = dVar52, 9 < uVar24 && (9 < uVar15)) &&
                   (pdVar23[uVar15 * 9 + 9] = local_120, 10 < uVar24)))) &&
                 (((10 < uVar15 && (pdVar23[uVar15 * 10 + 10] = dVar56, 0xb < uVar24)) &&
                  (0xb < uVar15)))) {
                pdVar23[uVar15 * 0xb + 0xb] = dVar55;
                pdVar25 = pdVar23 + uVar15;
                dVar55 = (local_180 * 6.0) / dVar51;
                dVar51 = ((double)local_158._0_8_ * 6.0) / dVar51;
                auVar29._0_8_ = -local_148;
                auVar29._8_8_ = 0x8000000000000000;
                dVar56 = (double)vmovlpd_avx(auVar29);
                pdVar23[6] = dVar56;
                auVar30._0_8_ = -dVar48;
                auVar30._8_8_ = 0x8000000000000000;
                dVar48 = (double)vmovlpd_avx(auVar30);
                pdVar25[7] = dVar48;
                auVar31._0_8_ = -dVar52;
                auVar31._8_8_ = 0x8000000000000000;
                dVar48 = (double)vmovlpd_avx(auVar31);
                pdVar23[uVar15 * 2 + 8] = dVar48;
                auVar32._0_8_ = -local_120;
                auVar32._8_8_ = 0x8000000000000000;
                dVar48 = (double)vmovlpd_avx(auVar32);
                pdVar23[uVar15 * 3 + 9] = dVar48;
                auVar33._0_8_ = -dVar51;
                auVar33._8_8_ = 0x8000000000000000;
                auVar35 = ZEXT1664(auVar33);
                auVar49._0_8_ = -dVar55;
                auVar49._8_8_ = 0x8000000000000000;
                pdVar23[uVar15 * 4 + 10] = (local_180 + local_180) / dVar1;
                pdVar23[uVar15 * 5 + 0xb] =
                     ((double)local_158._0_8_ + (double)local_158._0_8_) / dVar1;
                pdVar23[uVar15 * 4 + 8] = dVar55;
                dVar1 = (double)vmovlpd_avx(auVar33);
                pdVar23[uVar15 * 5 + 7] = dVar1;
                pdVar25[0xb] = dVar51;
                dVar1 = (double)vmovlpd_avx(auVar49);
                pdVar23[uVar15 * 2 + 10] = dVar1;
                pdVar25[5] = dVar51;
                dVar1 = (double)vmovlpd_avx(auVar49);
                pdVar23[uVar15 * 2 + 4] = dVar1;
                dVar1 = (double)vmovlpd_avx(auVar33);
                pdVar23[uVar15 * 7 + 0xb] = dVar1;
                pdVar23[uVar15 * 8 + 10] = dVar55;
                pdVar23 = pdVar23 + 1;
                uVar24 = 0;
                do {
                  if (uVar24 < 0xb) {
                    lVar27 = -0xb;
                    pdVar28 = pdVar25;
                    do {
                      lVar21 = lVar27 + 0xb;
                      auVar35 = ZEXT864((ulong)pdVar23[lVar21]);
                      lVar27 = lVar27 + 1;
                      *pdVar28 = pdVar23[lVar21];
                      pdVar28 = pdVar28 + uVar15;
                    } while (uVar24 + lVar27 != 0);
                  }
                  auVar29 = auVar35._0_16_;
                  uVar24 = uVar24 + 1;
                  pdVar23 = pdVar23 + uVar15 + 1;
                  pdVar25 = pdVar25 + uVar15 + 1;
                } while (uVar24 != 0xc);
                local_148 = in_XMM0_Qa;
                uStack_140 = in_XMM0_Qb;
                (*(((this->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChBeamSection)._vptr_ChBeamSection[6])();
                if ((auVar29._0_8_ != 0.0) || (NAN(auVar29._0_8_))) {
                  (*(((this->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_ChBeamSection)._vptr_ChBeamSection[6])();
                  auVar16._8_8_ = 0x8000000000000000;
                  auVar16._0_8_ = 0x8000000000000000;
                  local_158 = vxorpd_avx512vl(auVar29,auVar16);
                  local_180 = cos(local_158._0_8_);
                  auVar35._0_8_ = sin((double)local_158._0_8_);
                  auVar35._8_56_ = extraout_var;
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = local_180;
                  local_178.m_cols = 0;
                  local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0] = 1.0;
                  local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] = 0.0;
                  local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] = auVar35._0_8_ * 0.0;
                  dVar1 = local_180 * 0.0;
                  local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[2] = -0.0;
                  local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3] = local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[6] - dVar1;
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ =
                       local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[6];
                  auVar29 = vfmadd213sd_fma(ZEXT816(0),auVar36,auVar54);
                  local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] = dVar1 + local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array[6];
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = dVar1;
                  auVar30 = vfmsub213sd_fma(auVar50,ZEXT816(0) << 0x40,auVar35._0_16_);
                  local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4] = auVar29._0_8_;
                  local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7] = auVar30._0_8_;
                  local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8] = local_180;
                  local_178.m_data = (double *)0x0;
                  local_178.m_rows = 0;
                  local_d8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5] = auVar35._0_8_;
                  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_178,0x90,0xc,0xc);
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data = (PointerType)local_178.m_rows;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value = local_178.m_cols;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value = 0;
                  if ((local_178.m_cols | local_178.m_rows) < 0) {
                    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                                 );
                  }
                  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                            ((Matrix<double,__1,__1,_1,__1,__1> *)&local_178,
                             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                              *)&local_118,&local_181);
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data = (PointerType)0x0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value = 0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value = 0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .m_stride.m_outer.m_value = 0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
                       = 0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
                       = (double *)0x0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
                       = 0;
                  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
                  construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>
                              *)&local_118,expr);
                  local_70.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .m_stride.m_outer.m_value = 0;
                  local_70.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data = local_178.m_data;
                  local_70.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value = local_178.m_rows;
                  local_70.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value = local_178.m_cols;
                  if ((local_178.m_rows | local_178.m_cols) < 0 && local_178.m_data != (double *)0x0
                     ) {
                    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                                  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                                 );
                  }
                  local_70.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .m_stride.m_outer.m_value = local_178.m_cols;
                  ChMatrixCorotation::ComputeCK(&local_118,&local_d8,4,&local_70);
                  if (local_118.m_object.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_data != (double *)0x0) {
                    free((void *)local_118.m_object.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                 m_storage.m_data[-1]);
                  }
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data = (PointerType)0x0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value = 0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value = 0;
                  local_118.
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .m_stride.m_outer.m_value = 0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
                       = 0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
                       = (double *)0x0;
                  local_118.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
                       = 0;
                  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
                  construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>
                              *)&local_118,&local_178);
                  local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data = (PointerType)0x0;
                  local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value = 0;
                  local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value = 0;
                  local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  .m_stride.m_outer.m_value = 0;
                  bVar22 = Eigen::
                           RefBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>
                           ::construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                                     ((RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                                       *)&local_48,expr);
                  if (!bVar22) {
                    __assert_fail("success","/usr/include/eigen3/Eigen/src/Core/Ref.h",0x130,
                                  "Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>::Ref(PlainObjectBase<Derived> &, typename internal::enable_if<bool(Traits::template match<Derived>::MatchAtCompileTime), Derived>::type *) [PlainObjectType = Eigen::Matrix<double, -1, -1, 1>, Options = 0, StrideType = Eigen::OuterStride<>, Derived = Eigen::Matrix<double, -1, -1, 1>]"
                                 );
                  }
                  ChMatrixCorotation::ComputeKCt(&local_118,&local_d8,4,&local_48);
                  if (local_118.m_object.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_data != (double *)0x0) {
                    free((void *)local_118.m_object.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                 m_storage.m_data[-1]);
                  }
                  if (local_178.m_data != (double *)0x0) {
                    free((void *)local_178.m_data[-1]);
                  }
                }
                auVar20._8_8_ = uStack_80;
                auVar20._0_8_ = local_88;
                auVar19._8_8_ = uStack_140;
                auVar19._0_8_ = local_148;
                auVar53._8_8_ = 0;
                auVar53._0_8_ = local_130;
                if (((local_88 != 0.0) || (NAN(local_88))) ||
                   ((local_130 != 0.0 || (NAN(local_130))))) {
                  uVar24 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_rows;
                  if ((long)uVar24 < 1) goto LAB_0065d414;
                  uVar15 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data;
                  uVar26 = 0;
                  do {
                    if (((~((long)uVar15 >> 0x3f) & uVar15) == uVar26) || (uVar24 < 5))
                    goto LAB_0065d414;
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = pdVar23[uVar26];
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = pdVar23[uVar15 * 4 + uVar26];
                    auVar29 = vfmadd213sd_fma(auVar34,auVar53,auVar2);
                    pdVar23[uVar15 * 4 + uVar26] = auVar29._0_8_;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != 0xc);
                  uVar15 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  auVar17._8_8_ = 0x8000000000000000;
                  auVar17._0_8_ = 0x8000000000000000;
                  auVar29 = vxorpd_avx512vl(auVar20,auVar17);
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data;
                  uVar26 = 0;
                  do {
                    if (((~((long)uVar15 >> 0x3f) & uVar15) == uVar26) || (uVar24 == 5))
                    goto LAB_0065d414;
                    auVar37._8_8_ = 0;
                    auVar37._0_8_ = pdVar23[uVar26];
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = pdVar23[uVar15 * 5 + uVar26];
                    auVar30 = vfmadd213sd_fma(auVar37,auVar29,auVar3);
                    pdVar23[uVar15 * 5 + uVar26] = auVar30._0_8_;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != 0xc);
                  if ((long)uVar24 < 7) goto LAB_0065d414;
                  uVar15 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data;
                  uVar26 = 0;
                  do {
                    if (((~((long)uVar15 >> 0x3f) & uVar15) == uVar26) || (uVar24 < 0xb))
                    goto LAB_0065d414;
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = pdVar23[uVar15 * 6 + uVar26];
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = pdVar23[uVar15 * 10 + uVar26];
                    auVar30 = vfmadd213sd_fma(auVar38,auVar53,auVar4);
                    pdVar23[uVar15 * 10 + uVar26] = auVar30._0_8_;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != 0xc);
                  uVar15 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data;
                  uVar26 = 0;
                  do {
                    if (((~((long)uVar15 >> 0x3f) & uVar15) == uVar26) || (uVar24 == 0xb))
                    goto LAB_0065d414;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = pdVar23[uVar15 * 6 + uVar26];
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = pdVar23[uVar15 * 0xb + uVar26];
                    auVar30 = vfmadd213sd_fma(auVar39,auVar29,auVar5);
                    pdVar23[uVar15 * 0xb + uVar26] = auVar30._0_8_;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != 0xc);
                  uVar15 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  lVar27 = 0;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data + 4;
                  do {
                    if ((((long)uVar24 <= lVar27) || ((long)uVar15 < 1)) || (uVar15 < 5))
                    goto LAB_0065d414;
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = pdVar23[-4];
                    lVar27 = lVar27 + 1;
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = *pdVar23;
                    auVar30 = vfmadd213sd_fma(auVar40,auVar53,auVar6);
                    *pdVar23 = auVar30._0_8_;
                    pdVar23 = pdVar23 + uVar15;
                  } while (lVar27 != 0xc);
                  uVar15 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  lVar27 = 0;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data + 5;
                  do {
                    if ((((long)uVar24 <= lVar27) || ((long)uVar15 < 1)) || (uVar15 < 6))
                    goto LAB_0065d414;
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = pdVar23[-5];
                    lVar27 = lVar27 + 1;
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = *pdVar23;
                    auVar30 = vfmadd213sd_fma(auVar41,auVar29,auVar7);
                    *pdVar23 = auVar30._0_8_;
                    pdVar23 = pdVar23 + uVar15;
                  } while (lVar27 != 0xc);
                  uVar15 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  lVar27 = 0;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data + 10;
                  do {
                    if ((((long)uVar24 <= lVar27) || ((long)uVar15 < 7)) || (uVar15 < 0xb))
                    goto LAB_0065d414;
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = pdVar23[-4];
                    lVar27 = lVar27 + 1;
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = *pdVar23;
                    auVar30 = vfmadd213sd_fma(auVar42,auVar53,auVar8);
                    *pdVar23 = auVar30._0_8_;
                    pdVar23 = pdVar23 + uVar15;
                  } while (lVar27 != 0xc);
                  uVar15 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  lVar27 = 0;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data + 0xb;
                  do {
                    if ((((long)uVar24 <= lVar27) || ((long)uVar15 < 7)) || (uVar15 < 0xc))
                    goto LAB_0065d414;
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = pdVar23[-5];
                    lVar27 = lVar27 + 1;
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = *pdVar23;
                    auVar30 = vfmadd213sd_fma(auVar43,auVar29,auVar9);
                    *pdVar23 = auVar30._0_8_;
                    pdVar23 = pdVar23 + uVar15;
                  } while (lVar27 != 0xc);
                }
                if (((local_128 == 0.0) && (!NAN(local_128))) &&
                   ((local_148 == 0.0 && (!NAN(local_148))))) {
                  return;
                }
                uVar24 = (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                         .m_storage.m_rows;
                if (1 < (long)uVar24) {
                  uVar15 = (this->Km).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols;
                  pdVar23 = (this->Km).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                            m_storage.m_data;
                  auVar18._8_8_ = 0x8000000000000000;
                  auVar18._0_8_ = 0x8000000000000000;
                  auVar29 = vxorpd_avx512vl(auVar19,auVar18);
                  uVar26 = 0;
                  do {
                    if ((((~((long)uVar15 >> 0x3f) & uVar15) == uVar26) || (uVar24 == 2)) ||
                       (uVar24 < 4)) goto LAB_0065d414;
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = pdVar23[uVar15 + uVar26];
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = local_128 * pdVar23[uVar15 * 2 + uVar26];
                    auVar30 = vfmadd231sd_fma(auVar44,auVar29,auVar10);
                    pdVar23[uVar15 * 3 + uVar26] = auVar30._0_8_ + pdVar23[uVar15 * 3 + uVar26];
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != 0xc);
                  if (7 < (long)uVar24) {
                    uVar15 = (this->Km).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    pdVar23 = (this->Km).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data;
                    uVar26 = 0;
                    do {
                      if ((((~((long)uVar15 >> 0x3f) & uVar15) == uVar26) || (uVar24 == 8)) ||
                         (uVar24 < 10)) goto LAB_0065d414;
                      auVar11._8_8_ = 0;
                      auVar11._0_8_ = pdVar23[uVar15 * 7 + uVar26];
                      auVar45._8_8_ = 0;
                      auVar45._0_8_ = local_128 * pdVar23[uVar15 * 8 + uVar26];
                      auVar30 = vfmadd231sd_fma(auVar45,auVar29,auVar11);
                      pdVar23[uVar15 * 9 + uVar26] = auVar30._0_8_ + pdVar23[uVar15 * 9 + uVar26];
                      uVar26 = uVar26 + 1;
                    } while (uVar26 != 0xc);
                    uVar15 = (this->Km).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    lVar27 = 0;
                    pdVar23 = (this->Km).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data + 3;
                    do {
                      if ((((long)uVar24 <= lVar27) || ((long)uVar15 < 2)) ||
                         ((uVar15 == 2 || (uVar15 < 4)))) goto LAB_0065d414;
                      lVar27 = lVar27 + 1;
                      auVar12._8_8_ = 0;
                      auVar12._0_8_ = pdVar23[-2];
                      auVar46._8_8_ = 0;
                      auVar46._0_8_ = local_128 * pdVar23[-1];
                      auVar30 = vfmadd231sd_fma(auVar46,auVar29,auVar12);
                      *pdVar23 = auVar30._0_8_ + *pdVar23;
                      pdVar23 = pdVar23 + uVar15;
                    } while (lVar27 != 0xc);
                    uVar15 = (this->Km).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_cols;
                    lVar27 = 0;
                    pdVar23 = (this->Km).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                              m_storage.m_data + 9;
                    while (((lVar27 < (long)uVar24 && (7 < (long)uVar15)) &&
                           ((uVar15 != 8 && (9 < uVar15))))) {
                      lVar27 = lVar27 + 1;
                      auVar13._8_8_ = 0;
                      auVar13._0_8_ = pdVar23[-2];
                      auVar47._8_8_ = 0;
                      auVar47._0_8_ = local_128 * pdVar23[-1];
                      auVar30 = vfmadd231sd_fma(auVar47,auVar29,auVar13);
                      *pdVar23 = auVar30._0_8_ + *pdVar23;
                      pdVar23 = pdVar23 + uVar15;
                      if (lVar27 == 0xc) {
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0065d414:
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementBeamEuler::ComputeStiffnessMatrix() {
    assert(section);

    double EA = this->section->GetAxialRigidity();
    double EIyy = this->section->GetYbendingRigidity();
    double EIzz = this->section->GetZbendingRigidity();
    double GJ = this->section->GetXtorsionRigidity();
    double Cy = this->section->GetCentroidY();
    double Cz = this->section->GetCentroidZ();
    double Sy = this->section->GetShearCenterY();
    double Sz = this->section->GetShearCenterZ();

    double h = this->length;

    double om_xz = 0;  // For Euler-Bernoulli
    double om_xy = 0;  // For Euler-Bernoulli
    /*
    if (false) {
        //// TEST REDDY BEAMS
        double Ks_z = section->Ks_z;
        double Ks_y = section->Ks_y;
        double om_xz = E * Iyy / (G * Area * Ks_z * h);  // For Reddy's RBT
        double om_xy = E * Izz / (G * Area * Ks_y * h);  // For Reddy's RBT
    }
    */
    double u_xz = 1 + 12 * om_xz;
    double l_xz = 1 + 3 * om_xz;
    double e_xz = 1 - 6 * om_xz;
    double u_xy = 1 + 12 * om_xy;
    double l_xy = 1 + 3 * om_xy;
    double e_xy = 1 - 6 * om_xy;

    double k_u = EA / h;
    double k_f = GJ / h;

    double k_w = 12 * EIyy / (u_xz * h * h * h);
    double k_v = 12 * EIzz / (u_xy * h * h * h);

    double k_t = 4 * EIyy * l_xz / (u_xz * h);
    double k_p = 4 * EIzz * l_xy / (u_xy * h);

    double k_wt = 6 * EIyy / (u_xz * h * h);
    double k_vp = 6 * EIzz / (u_xy * h * h);

    double k_tt = 2 * EIyy * e_xz / (u_xz * h);
    double k_pp = 2 * EIzz * e_xy / (u_xy * h);

    Km(0, 0) = k_u;
    Km(1, 1) = k_v;
    Km(2, 2) = k_w;
    Km(3, 3) = k_f;
    Km(4, 4) = k_t;
    Km(5, 5) = k_p;
    Km(6, 6) = k_u;
    Km(7, 7) = k_v;
    Km(8, 8) = k_w;
    Km(9, 9) = k_f;
    Km(10, 10) = k_t;
    Km(11, 11) = k_p;

    Km(0, 6) = -k_u;
    Km(1, 7) = -k_v;
    Km(2, 8) = -k_w;
    Km(3, 9) = -k_f;
    Km(4, 10) = k_tt;
    Km(5, 11) = k_pp;

    Km(4, 8) = k_wt;
    Km(5, 7) = -k_vp;
    Km(1, 11) = k_vp;
    Km(2, 10) = -k_wt;

    Km(1, 5) = k_vp;
    Km(2, 4) = -k_wt;
    Km(7, 11) = -k_vp;
    Km(8, 10) = k_wt;

    // symmetric part;
    for (int r = 0; r < 12; r++)
        for (int c = r + 1; c < 12; c++)
            Km(c, r) = Km(r, c);

    // In case the section is rotated:
    if (this->section->GetSectionRotation()) {
        // Do [K]^ = [R][K][R]'
        ChMatrix33<> Rotsect;
        Rotsect.Set_A_Rxyz(ChVector<>(-section->GetSectionRotation(), 0, 0));
        ChMatrixDynamic<> CKtemp(12, 12);
        CKtemp.setZero();
        ChMatrixCorotation::ComputeCK(this->Km, Rotsect, 4, CKtemp);
        ChMatrixCorotation::ComputeKCt(CKtemp, Rotsect, 4, this->Km);
    }
    // In case the section has a centroid displacement:

    if (Cy || Cz) {
        // Do [K]" = [T_c][K]^[T_c]'

        for (int i = 0; i < 12; ++i)
            this->Km(4, i) += Cz * this->Km(0, i);
        for (int i = 0; i < 12; ++i)
            this->Km(5, i) += -Cy * this->Km(0, i);

        for (int i = 0; i < 12; ++i)
            this->Km(10, i) += Cz * this->Km(6, i);
        for (int i = 0; i < 12; ++i)
            this->Km(11, i) += -Cy * this->Km(6, i);

        for (int i = 0; i < 12; ++i)
            this->Km(i, 4) += Cz * this->Km(i, 0);
        for (int i = 0; i < 12; ++i)
            this->Km(i, 5) += -Cy * this->Km(i, 0);

        for (int i = 0; i < 12; ++i)
            this->Km(i, 10) += Cz * this->Km(i, 6);
        for (int i = 0; i < 12; ++i)
            this->Km(i, 11) += -Cy * this->Km(i, 6);
    }

    // In case the section has a shear center displacement:
    if (Sy || Sz) {
        // Do [K]?= [T_s][K]"[T_s]'

        for (int i = 0; i < 12; ++i)
            this->Km(3, i) +=
                - Sz * this->Km(1, i) + Sy * this->Km(2, i);
        for (int i = 0; i < 12; ++i)
            this->Km(9, i) +=
                - Sz * this->Km(7, i) + Sy * this->Km(8, i);

        for (int i = 0; i < 12; ++i)
            this->Km(i, 3) +=
                - Sz * this->Km(i, 1) + Sy * this->Km(i, 2);
        for (int i = 0; i < 12; ++i)
            this->Km(i, 9) +=
                - Sz * this->Km(i, 7) + Sy * this->Km(i, 8);
    }
}